

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.cpp
# Opt level: O1

ItemSource * ItemSource::from_json(Json *json,World *world,bool resolve_map_entities)

{
  pointer ppEVar1;
  vector<Entity_*,_std::allocator<Entity_*>_> *pvVar2;
  uint8_t uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  uint32_t address_in_rom;
  uint uVar6;
  uint uVar7;
  pointer pbVar8;
  bool bVar9;
  int iVar10;
  const_reference pvVar11;
  ItemSourceOnGround *this;
  mapped_type *ppMVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  ostream *poVar14;
  LandstalkerException *pLVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pcVar17;
  ulong uVar18;
  pointer this_00;
  uint ret;
  vector<Entity_*,_std::allocator<Entity_*>_> entities;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hints;
  vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  entity_jsons;
  stringstream msg;
  Entity *entity;
  string local_358;
  vector<Entity_*,_std::allocator<Entity_*>_> local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  World *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [23];
  Json *local_f0;
  vector<Entity_*,_std::allocator<Entity_*>_> local_e8;
  vector<Entity_*,_std::allocator<Entity_*>_> local_d0;
  Entity *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar17 = local_278 + 0x10;
  local_300 = world;
  local_278._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"name","");
  pvVar11 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at(json,(key_type *)local_278);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2b8,pvVar11);
  if ((pointer)local_278._0_8_ != pcVar17) {
    operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  local_278._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"type","");
  pvVar11 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at(json,(key_type *)local_278);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2f8,pvVar11);
  if ((pointer)local_278._0_8_ != pcVar17) {
    operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  local_278._0_8_ = pcVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"nodeId","");
  pvVar11 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at(json,(key_type *)local_278);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_298,pvVar11);
  if ((pointer)local_278._0_8_ != pcVar17) {
    operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
  }
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar9 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(json,(char (*) [6])"hints");
  if (bVar9) {
    local_278._0_8_ = pcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"hints","");
    pvVar11 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::at(json,(key_type *)local_278);
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (pvVar11,&local_318);
    if ((pointer)local_278._0_8_ != pcVar17) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
  }
  iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_2f8,"chest");
  if (iVar10 == 0) {
    local_278._0_8_ = pcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"chestId","");
    pvVar11 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::at(json,(key_type *)local_278);
    local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
              (pvVar11,(uchar *)&local_358);
    uVar4 = (byte)local_358._M_dataplus._M_p;
    if ((pointer)local_278._0_8_ != pcVar17) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    this = (ItemSourceOnGround *)operator_new(0x70);
    ItemSource((ItemSource *)this,&local_2b8,&local_298,&local_318);
    (this->super_ItemSource)._vptr_ItemSource = (_func_int **)&PTR__ItemSource_00261638;
    *(undefined1 *)
     &(this->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_start = uVar4;
    goto LAB_0012aeb3;
  }
  iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_2f8,"ground");
  if (iVar10 != 0) {
    iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare(&local_2f8,"shop");
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&local_2f8,"reward");
      if (iVar10 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_278);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_278 + 0x10),"Invalid item source type name \'",0x1f);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_278 + 0x10),local_2f8._M_dataplus._M_p,
                             local_2f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' found in JSON.",0x10);
        pLVar15 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LandstalkerException::LandstalkerException(pLVar15,&local_358);
        *(undefined ***)pLVar15 = &PTR__LandstalkerException_002617b0;
        __cxa_throw(pLVar15,&JsonParsingException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      local_278._0_8_ = pcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"address","");
      pvVar11 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at(json,(key_type *)local_278);
      local_358._M_dataplus._M_p._0_4_ = 0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                (pvVar11,(uint *)&local_358);
      address_in_rom = (uint)local_358._M_dataplus._M_p;
      if ((pointer)local_278._0_8_ != pcVar17) {
        operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
      }
      local_278._0_8_ = pcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"rewardId","");
      pvVar11 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at(json,(key_type *)local_278);
      local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffffff00;
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
                (pvVar11,(uchar *)&local_358);
      uVar3 = (byte)local_358._M_dataplus._M_p;
      if ((pointer)local_278._0_8_ != pcVar17) {
        operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
      }
      this = (ItemSourceOnGround *)operator_new(0x70);
      ItemSourceReward::ItemSourceReward
                ((ItemSourceReward *)this,address_in_rom,&local_2b8,uVar3,&local_298,&local_318);
      goto LAB_0012aeb3;
    }
  }
  local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (resolve_map_entities) {
    local_2d8.
    super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_2d8.
    super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_2d8.
    super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar9 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::contains<const_char_(&)[9],_0>(json,(char (*) [9])0x2149d6);
    local_f0 = json;
    if (bVar9) {
      local_278._0_8_ = pcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"entities","");
      pvVar11 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at(json,(key_type *)local_278);
      nlohmann::detail::
      from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_0>
                (pvVar11,&local_2d8);
    }
    else {
      bVar9 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::contains<const_char_(&)[7],_0>(json,(char (*) [7])0x214b7b);
      if (!bVar9) {
        pLVar15 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        std::operator+(&local_358,"No entity information was provided for ground item source \'",
                       &local_2b8);
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_358,"\'");
        local_278._0_8_ = (pbVar13->_M_dataplus)._M_p;
        paVar16 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._0_8_ == paVar16) {
          local_268[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_268[0]._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          local_278._0_8_ = local_278 + 0x10;
        }
        else {
          local_268[0]._0_8_ = paVar16->_M_allocated_capacity;
        }
        local_278._8_8_ = pbVar13->_M_string_length;
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        LandstalkerException::LandstalkerException(pLVar15,(string *)local_278);
        __cxa_throw(pLVar15,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      local_278._0_8_ = pcVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"entity","");
      pvVar11 = nlohmann::
                basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::at(json,(key_type *)local_278);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_358,pvVar11);
      std::
      vector<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
      ::
      _M_assign_aux<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const*>
                ((vector<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                  *)&local_2d8,&local_358,&local_358.field_2);
      nlohmann::
      basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_358);
    }
    if ((pointer)local_278._0_8_ != pcVar17) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    pbVar8 = local_2d8.
             super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_2d8.
        super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_300 = (World *)&local_300->_maps;
      this_00 = local_2d8.
                super__Vector_base<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar17 = local_278 + 0x10;
        local_278._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"mapId","");
        pvVar11 = nlohmann::
                  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::at(this_00,(key_type *)local_278);
        local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffff0000;
        nlohmann::detail::
        from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
                  (pvVar11,(unsigned_short *)&local_358);
        uVar6 = (uint)local_358._M_dataplus._M_p;
        uVar5 = local_358._M_dataplus._M_p._0_2_;
        if ((pointer)local_278._0_8_ != pcVar17) {
          operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
        }
        local_278._0_8_ = pcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"entityId","");
        pvVar11 = nlohmann::
                  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::at(this_00,(key_type *)local_278);
        local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffffff00;
        nlohmann::detail::
        from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
                  (pvVar11,(uchar *)&local_358);
        uVar7 = (uint)local_358._M_dataplus._M_p;
        uVar18 = (ulong)(byte)local_358._M_dataplus._M_p;
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
        }
        local_278._0_2_ = uVar5;
        ppMVar12 = std::
                   map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                   ::at((map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                         *)local_300,(key_type *)local_278);
        ppEVar1 = ((*ppMVar12)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)((*ppMVar12)->_entities).
                          super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar18) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar18);
        }
        local_b8 = ppEVar1[uVar18];
        if ((local_b8->_attrs).type_id < 0xc0) {
          pLVar15 = (LandstalkerException *)__cxa_allocate_exception(0x28);
          std::__cxx11::to_string(&local_70,uVar7 & 0xff);
          std::operator+(&local_50,"EntityType ",&local_70);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_50," of map ");
          local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar16 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p == paVar16) {
            local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          }
          local_b0._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::to_string(&local_90,uVar6 & 0xffff);
          std::operator+(&local_358,&local_b0,&local_90);
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_358," is not a ground item.");
          local_278._0_8_ = (pbVar13->_M_dataplus)._M_p;
          paVar16 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._0_8_ == paVar16) {
            local_268[0]._0_8_ = paVar16->_M_allocated_capacity;
            local_268[0]._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_278._0_8_ = local_278 + 0x10;
          }
          else {
            local_268[0]._0_8_ = paVar16->_M_allocated_capacity;
          }
          local_278._8_8_ = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          LandstalkerException::LandstalkerException(pLVar15,(string *)local_278);
          __cxa_throw(pLVar15,&LandstalkerException::typeinfo,
                      LandstalkerException::~LandstalkerException);
        }
        std::vector<Entity*,std::allocator<Entity*>>::emplace_back<Entity*&>
                  ((vector<Entity*,std::allocator<Entity*>> *)&local_338,&local_b8);
        this_00 = this_00 + 1;
      } while (this_00 != pbVar8);
    }
    std::
    vector<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~vector(&local_2d8);
    json = local_f0;
  }
  pcVar17 = local_278 + 0x10;
  iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_2f8,"shop");
  local_278._0_8_ = pcVar17;
  if (iVar10 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"shopItemId","");
    pvVar11 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::at(json,(key_type *)local_278);
    local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
              (pvVar11,(uchar *)&local_358);
    uVar3 = (byte)local_358._M_dataplus._M_p;
    if ((pointer)local_278._0_8_ != pcVar17) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    this = (ItemSourceOnGround *)operator_new(0x88);
    std::vector<Entity_*,_std::allocator<Entity_*>_>::vector(&local_d0,&local_338);
    ItemSourceShop::ItemSourceShop
              ((ItemSourceShop *)this,&local_2b8,&local_d0,uVar3,&local_298,&local_318);
    if (local_d0.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      pvVar2 = &local_d0;
      local_e8.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d0.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      goto LAB_0012ae91;
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"groundItemId","");
    pvVar11 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::at(json,(key_type *)local_278);
    local_358._M_dataplus._M_p._0_4_ = (uint)local_358._M_dataplus._M_p & 0xffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
              (pvVar11,(uchar *)&local_358);
    uVar3 = (byte)local_358._M_dataplus._M_p;
    if ((pointer)local_278._0_8_ != pcVar17) {
      operator_delete((void *)local_278._0_8_,local_268[0]._M_allocated_capacity + 1);
    }
    this = (ItemSourceOnGround *)operator_new(0x88);
    std::vector<Entity_*,_std::allocator<Entity_*>_>::vector(&local_e8,&local_338);
    ItemSourceOnGround::ItemSourceOnGround
              (this,&local_2b8,&local_e8,uVar3,&local_298,&local_318,true);
    if (local_e8.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      pvVar2 = &local_e8;
LAB_0012ae91:
      operator_delete(local_e8.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)(pvVar2->super__Vector_base<Entity_*,_std::allocator<Entity_*>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
  }
  if (local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0012aeb3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  return &this->super_ItemSource;
}

Assistant:

ItemSource* ItemSource::from_json(const Json& json, const World& world, bool resolve_map_entities)
{
    const std::string& name = json.at("name");
    const std::string& type = json.at("type");
    const std::string& node_id = json.at("nodeId");

    std::vector<std::string> hints;
    if(json.contains("hints")) 
        json.at("hints").get_to(hints);

    if(type == "chest")
    {
        uint8_t chest_id = json.at("chestId");
        return new ItemSourceChest(chest_id, name, node_id, hints);
    }
    else if(type == "ground" || type == "shop")
    {
        std::vector<Entity*> entities;

        if(resolve_map_entities)
        {
            std::vector<Json> entity_jsons;
            if(json.contains("entities"))
                json.at("entities").get_to(entity_jsons);
            else if(json.contains("entity"))
                entity_jsons = { json.at("entity") };
            else
                throw LandstalkerException("No entity information was provided for ground item source '" + name + "'");

            for(const Json& entity_json : entity_jsons)
            {
                uint16_t map_id = entity_json.at("mapId");
                uint8_t entity_id = entity_json.at("entityId");
                Entity* entity = world.map(map_id)->entity(entity_id);
                if(entity->entity_type_id() < 0xC0) // 0xC0 is the first ground item ID
                    throw LandstalkerException("EntityType " + std::to_string(entity_id) + " of map " + std::to_string(map_id) + " is not a ground item.");

                entities.emplace_back(entity);
            }
        }

        if(type == "shop")
        {
            uint8_t shop_item_id = json.at("shopItemId");
            return new ItemSourceShop(name, entities, shop_item_id, node_id, hints);
        }
        else
        {
            uint8_t ground_item_id = json.at("groundItemId");
            return new ItemSourceOnGround(name, entities, ground_item_id, node_id, hints);
        }
    }
    else if(type == "reward")
    {
        uint32_t address_in_rom = json.at("address");
        uint8_t reward_id = json.at("rewardId");
        return new ItemSourceReward(address_in_rom, name, reward_id, node_id, hints);
    }

    std::stringstream msg;
    msg << "Invalid item source type name '" << type << "' found in JSON.";
    throw JsonParsingException(msg.str());
}